

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void move(Terminal *term,wchar_t x,wchar_t y,wchar_t marg_clip)

{
  wchar_t local_18;
  wchar_t marg_clip_local;
  wchar_t y_local;
  wchar_t x_local;
  Terminal *term_local;
  
  marg_clip_local = x;
  if (x < L'\0') {
    marg_clip_local = L'\0';
  }
  if (term->cols <= marg_clip_local) {
    marg_clip_local = term->cols + L'\xffffffff';
  }
  local_18 = y;
  if (marg_clip != L'\0') {
    if (((term->marg_t <= (term->curs).y) || (marg_clip == L'\x02')) && (y < term->marg_t)) {
      local_18 = term->marg_t;
    }
    if ((((term->curs).y <= term->marg_b) || (marg_clip == L'\x02')) && (term->marg_b < local_18)) {
      local_18 = term->marg_b;
    }
  }
  if (local_18 < L'\0') {
    local_18 = L'\0';
  }
  if (term->rows <= local_18) {
    local_18 = term->rows + L'\xffffffff';
  }
  (term->curs).x = marg_clip_local;
  (term->curs).y = local_18;
  term->wrapnext = false;
  return;
}

Assistant:

static void move(Terminal *term, int x, int y, int marg_clip)
{
    if (x < 0)
        x = 0;
    if (x >= term->cols)
        x = term->cols - 1;
    if (marg_clip) {
        if ((term->curs.y >= term->marg_t || marg_clip == 2) &&
            y < term->marg_t)
            y = term->marg_t;
        if ((term->curs.y <= term->marg_b || marg_clip == 2) &&
            y > term->marg_b)
            y = term->marg_b;
    }
    if (y < 0)
        y = 0;
    if (y >= term->rows)
        y = term->rows - 1;
    term->curs.x = x;
    term->curs.y = y;
    term->wrapnext = false;
}